

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_DESTRUCTION(effect_handler_context_t *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  wchar_t wVar3;
  int x;
  int y;
  player_upkeep *ppVar4;
  wchar_t wVar5;
  player *ppVar6;
  _Bool _Var7;
  wchar_t wVar8;
  uint32_t uVar9;
  loc_conflict grid1;
  square *psVar10;
  object *obj;
  wchar_t wVar11;
  wchar_t wVar12;
  loc grid;
  bool bVar13;
  
  ppVar6 = player;
  wVar11 = context->subtype;
  wVar3 = context->radius;
  x = (player->grid).x;
  y = (player->grid).y;
  context->ident = true;
  if ((ppVar6->depth == 0) || (ppVar6->upkeep->arena_level == true)) {
    msg("The ground shakes for a moment.");
    return true;
  }
  if (y - wVar3 <= y + wVar3) {
    wVar5 = y - wVar3;
    do {
      wVar12 = x - wVar3;
      if (x - wVar3 <= x + wVar3) {
        do {
          grid.y = wVar5;
          grid.x = wVar12;
          _Var7 = square_in_bounds_fully(cave,grid);
          if (_Var7) {
            grid1 = loc(x,y);
            wVar8 = distance(grid1,(loc_conflict)grid);
            if (wVar8 <= wVar3) {
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,4);
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,3);
              _Var7 = square_isbright(cave,grid);
              if (!_Var7) {
                psVar10 = square(cave,grid);
                flag_off(psVar10->info,3,2);
              }
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,5);
              square_forget(cave,grid);
              square_light_spot((chunk *)cave,grid);
              _Var7 = loc_eq((loc_conflict)grid,player->grid);
              if (!_Var7) {
                delete_monster((chunk *)cave,(loc_conflict)grid);
                _Var7 = square_isstairs(cave,grid);
                if ((!_Var7) && (_Var7 = square_isperm(cave,grid), !_Var7)) {
                  for (obj = square_object(cave,grid); obj != (object *)0x0; obj = obj->next) {
                    if (obj->artifact != (artifact *)0x0) {
                      if (((player->opts).opt[0x24] != false) ||
                         (_Var7 = obj_is_known_artifact(obj), _Var7)) {
                        history_lose_artifact(player,obj->artifact);
                        _Var7 = true;
                      }
                      else {
                        _Var7 = false;
                      }
                      mark_artifact_created(obj->artifact,_Var7);
                    }
                  }
                  square_excise_all_imagined((chunk_conflict *)player->cave,cave,grid);
                  square_excise_pile((chunk_conflict *)player->cave,grid);
                  square_excise_pile(cave,grid);
                  square_destroy(cave,grid);
                }
              }
            }
          }
          bVar13 = wVar12 != x + wVar3;
          wVar12 = wVar12 + L'\x01';
        } while (bVar13);
      }
      bVar13 = wVar5 != y + wVar3;
      wVar5 = wVar5 + L'\x01';
    } while (bVar13);
  }
  if (wVar11 == L'\x06') {
    msg("Darkness seems to crush you!");
    equip_learn_element(player,L'\x06');
    wVar11 = L'\x06';
  }
  else {
    if (wVar11 != L'\x05') goto LAB_0013af67;
    msg("There is a searing blast of light!");
    equip_learn_element(player,L'\x05');
    wVar11 = L'\x05';
  }
  _Var7 = player_resists(player,wVar11);
  ppVar6 = player;
  if (!_Var7) {
    uVar9 = Rand_div(10);
    player_inc_timed(ppVar6,L'\x02',uVar9 + L'\v',true,true,true);
  }
LAB_0013af67:
  ppVar4 = player->upkeep;
  puVar1 = &ppVar4->update;
  *puVar1 = *puVar1 | 0x60;
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc0;
  return true;
}

Assistant:

bool effect_handler_DESTRUCTION(effect_handler_context_t *context)
{
	int k, r = context->radius;
	int elem = context->subtype;
	int py = player->grid.y;
	int px = player->grid.x;
	struct loc grid;

	context->ident = true;

	/* No effect in town or arena */
	if ((!player->depth) || (player->upkeep->arena_level)) {
		msg("The ground shakes for a moment.");
		return true;
	}

	/* Big area of affect */
	for (grid.y = (py - r); grid.y <= (py + r); grid.y++) {
		for (grid.x = (px - r); grid.x <= (px + r); grid.x++) {
			/* Skip illegal grids */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Extract the distance */
			k = distance(loc(px, py), grid);

			/* Stay in the circle of death */
			if (k > r) continue;

			/* Lose room and vault */
			sqinfo_off(square(cave, grid)->info, SQUARE_ROOM);
			sqinfo_off(square(cave, grid)->info, SQUARE_VAULT);

			/* Forget completely */
			if (!square_isbright(cave, grid)) {
				sqinfo_off(square(cave, grid)->info, SQUARE_GLOW);
			}
			sqinfo_off(square(cave, grid)->info, SQUARE_SEEN);
			square_forget(cave, grid);
			square_light_spot(cave, grid);

			/* Deal with player later */
			if (loc_eq(grid, player->grid)) continue;

			/* Delete the monster (if any) */
			delete_monster(cave, grid);

			/* Don't remove stairs */
			if (square_isstairs(cave, grid)) continue;

			/* Destroy any grid that isn't a permament wall */
			if (!square_isperm(cave, grid)) {
				/* Deal with artifacts */
				struct object *obj = square_object(cave, grid);
				while (obj) {
					if (obj->artifact) {
						if (OPT(player, birth_lose_arts) ||
							obj_is_known_artifact(obj)) {
							history_lose_artifact(player, obj->artifact);
							mark_artifact_created(
								obj->artifact,
								true);
						} else {
							mark_artifact_created(
								obj->artifact,
								false);
						}
					}
					obj = obj->next;
				}

				/* Delete objects */
				square_excise_all_imagined(player->cave, cave,
					grid);
				square_excise_pile(player->cave, grid);
				square_excise_pile(cave, grid);
				square_destroy(cave, grid);
			}
		}
	}

	/* Player is affected */
	if (elem == ELEM_LIGHT) {
		msg("There is a searing blast of light!");
		equip_learn_element(player, ELEM_LIGHT);
		if (!player_resists(player, ELEM_LIGHT)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	} else if (elem == ELEM_DARK) {
		msg("Darkness seems to crush you!");
		equip_learn_element(player, ELEM_DARK);
		if (!player_resists(player, ELEM_DARK)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}